

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

EStatusCode __thiscall Type1Input::ParseCharstrings(Type1Input *this)

{
  bool bVar1;
  int iVar2;
  EStatusCode EVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>,_bool>
  pVar4;
  BoolAndString local_1b8;
  _Base_ptr local_190;
  undefined1 local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>
  local_180;
  BoolAndString local_150;
  BoolAndString local_128;
  BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_> local_fc;
  string local_f8;
  BoolAndString local_d8;
  undefined4 local_ac;
  BoolAndString local_a8;
  undefined1 local_70 [8];
  Type1CharString charString;
  string characterName;
  BoolAndString token;
  Type1Input *this_local;
  
  token.second.field_2._8_8_ = this;
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&characterName.field_2 + 8));
  std::__cxx11::string::string((string *)&charString.CodeLength);
  while (bVar1 = InputPFBDecodeStream::NotEnded(&this->mPFBDecoder), bVar1) {
    InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_a8,&this->mPFBDecoder);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&characterName.field_2 + 8),&local_a8);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair(&local_a8);
    if (((characterName.field_2._M_local_buf[8] & 1U) == 0) ||
       (iVar2 = std::__cxx11::string::compare(&token.first), iVar2 == 0)) break;
  }
  if ((characterName.field_2._M_local_buf[8] & 1U) == 0) {
    this_local._4_4_ = eFailure;
  }
  else {
    while( true ) {
      bVar1 = false;
      if ((characterName.field_2._M_local_buf[8] & 1U) != 0) {
        EVar3 = InputPFBDecodeStream::GetInternalState(&this->mPFBDecoder);
        bVar1 = EVar3 == eSuccess;
      }
      if (!bVar1) break;
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_d8,&this->mPFBDecoder);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&characterName.field_2 + 8),&local_d8);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair(&local_d8);
      bVar1 = std::operator==("end",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&token);
      if (bVar1) break;
      FromPSName(&local_f8,this,(string *)&token);
      std::__cxx11::string::operator=((string *)&charString.CodeLength,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_128,&this->mPFBDecoder);
      BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_>::BoxingBaseWithRW
                (&local_fc,&local_128.second);
      charString.Code._0_4_ = BoxingBase::operator_cast_to_int((BoxingBase *)&local_fc);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair(&local_128);
      local_70 = (undefined1  [8])operator_new__((long)(int)charString.Code);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_150,&this->mPFBDecoder);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair(&local_150);
      InputPFBDecodeStream::Read(&this->mPFBDecoder,(Byte *)local_70,(long)(int)charString.Code);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Type1CharString_&,_true>
                (&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &charString.CodeLength,(Type1CharString *)local_70);
      pVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
              ::insert(&this->mCharStrings,&local_180);
      local_190 = (_Base_ptr)pVar4.first._M_node;
      local_188 = pVar4.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>
      ::~pair(&local_180);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_1b8,&this->mPFBDecoder);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair(&local_1b8);
    }
    this_local._4_4_ = InputPFBDecodeStream::GetInternalState(&this->mPFBDecoder);
  }
  local_ac = 1;
  std::__cxx11::string::~string((string *)&charString.CodeLength);
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&characterName.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1Input::ParseCharstrings()
{
	BoolAndString token;
	std::string characterName;
	Type1CharString charString;

	// skip till "begin"
	while(mPFBDecoder.NotEnded())
	{
		token = mPFBDecoder.GetNextToken();
		if(!token.first || token.second.compare("begin") == 0)
			break;
	}
	if(!token.first)
		return eFailure;

	// Charstrings look like this:
	// charactername nbytes RD ~n~binary~bytes~ ND
	while(token.first && mPFBDecoder.GetInternalState() == eSuccess)
	{
		token = mPFBDecoder.GetNextToken();

		if("end" == token.second)
			break;

		characterName = FromPSName(token.second);

		charString.CodeLength = Int(mPFBDecoder.GetNextToken().second);

		charString.Code = new Byte[charString.CodeLength];

		// skip the RD token (will also skip space)
		mPFBDecoder.GetNextToken();


		mPFBDecoder.Read(charString.Code,charString.CodeLength);

		mCharStrings.insert(StringToType1CharStringMap::value_type(characterName,charString));

		// skip ND token
		mPFBDecoder.GetNextToken();
	}

	return mPFBDecoder.GetInternalState();
}